

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

MatrixXd * __thiscall
lf::fe::FeHierarchicSegment<double>::EvaluationNodes
          (MatrixXd *__return_storage_ptr__,FeHierarchicSegment<double> *this)

{
  size_type blockCols;
  Scalar *pSVar1;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  Type local_70;
  size_type local_24 [2];
  undefined1 local_19;
  FeHierarchicSegment<double> *local_18;
  FeHierarchicSegment<double> *this_local;
  MatrixXd *nodes;
  
  local_19 = 0;
  local_24[1] = 1;
  local_18 = this;
  this_local = (FeHierarchicSegment<double> *)__return_storage_ptr__;
  local_24[0] = NumEvaluationNodes(this);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,(int *)(local_24 + 1),local_24);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,0);
  *pSVar1 = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,0,1);
  *pSVar1 = 1.0;
  other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
          quad::QuadRule::Points(this->qr_dual_);
  blockCols = quad::QuadRule::NumPoints(this->qr_dual_);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_int>
            (&local_70,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,2,
             1,blockCols);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_70,other);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Eigen::MatrixXd EvaluationNodes() const override {
    // First two nodes are vertices of the segment
    Eigen::MatrixXd nodes(1, NumEvaluationNodes());
    nodes(0, 0) = 0;
    nodes(0, 1) = 1;
    // The other nodes are quadrature points
    nodes.block(0, 2, 1, qr_dual_->NumPoints()) = qr_dual_->Points();
    return nodes;
  }